

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# agg_vpgen_clip_polyline.cpp
# Opt level: O1

void __thiscall agg::vpgen_clip_polyline::line_to(vpgen_clip_polyline *this,double x,double y)

{
  uint uVar1;
  uint uVar2;
  ulong uVar3;
  double y2;
  double x2;
  double local_28;
  double local_20;
  
  local_28 = y;
  local_20 = x;
  uVar2 = clip_line_segment<double>
                    ((double *)(this + 0x20),(double *)(this + 0x28),&local_20,&local_28,
                     (rect_base<double> *)this);
  *(undefined8 *)(this + 0x58) = 0;
  if ((uVar2 & 4) == 0) {
    if (((uVar2 & 1) != 0) || (this[0x60] == (vpgen_clip_polyline)0x1)) {
      *(undefined8 *)(this + 0x30) = *(undefined8 *)(this + 0x20);
      *(undefined8 *)(this + 0x40) = *(undefined8 *)(this + 0x28);
      *(undefined4 *)(this + 0x50) = 1;
      *(undefined4 *)(this + 0x58) = 1;
    }
    uVar1 = *(uint *)(this + 0x58);
    uVar3 = (ulong)uVar1;
    *(double *)(this + uVar3 * 8 + 0x30) = local_20;
    *(double *)(this + uVar3 * 8 + 0x40) = local_28;
    *(uint *)(this + 0x58) = uVar1 + 1;
    *(undefined4 *)(this + uVar3 * 4 + 0x50) = 2;
    this[0x60] = (vpgen_clip_polyline)((byte)uVar2 >> 1 & 1);
  }
  *(double *)(this + 0x20) = x;
  *(double *)(this + 0x28) = y;
  return;
}

Assistant:

void vpgen_clip_polyline::line_to(double x, double y)
    {
        double x2 = x;
        double y2 = y;
        unsigned flags = clip_line_segment(&m_x1, &m_y1, &x2, &y2, m_clip_box);

        m_vertex = 0;
        m_num_vertices = 0;
        if((flags & 4) == 0)
        {
            if((flags & 1) != 0 || m_move_to)
            {
                m_x[0] = m_x1;
                m_y[0] = m_y1;
                m_cmd[0] = path_cmd_move_to;
                m_num_vertices = 1;
            }
            m_x[m_num_vertices] = x2;
            m_y[m_num_vertices] = y2;
            m_cmd[m_num_vertices++] = path_cmd_line_to;
            m_move_to = (flags & 2) != 0;
        }
        m_x1 = x;
        m_y1 = y;
    }